

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

string * __thiscall
Fixpp::Writer::
write<Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
          (string *__return_storage_ptr__,Writer *this,
          VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
          *header,VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                  *message)

{
  undefined1 *__s;
  undefined8 uVar1;
  undefined8 uVar2;
  string *psVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  runtime_error *prVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  undefined1 local_750 [8];
  StreamBuf<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  buf;
  ostringstream error;
  long local_170;
  ostream os;
  undefined8 auStack_160 [26];
  char acStack_90 [48];
  string local_60 [32];
  code *local_40;
  string *local_38;
  
  local_40 = std::ostream::_M_insert<unsigned_long>;
  local_750 = (undefined1  [8])std::ostream::_M_insert<unsigned_long>;
  buf.super_SmallStreamBuf<1024UL,_char>.super_basic_streambuf<char,_std::char_traits<char>_> =
       (basic_streambuf<char,_std::char_traits<char>_>)0x0;
  buf.super_SmallStreamBuf<1024UL,_char>._1_7_ = 0;
  buf.super_SmallStreamBuf<1024UL,_char>._8_8_ = 0;
  buf.super_SmallStreamBuf<1024UL,_char>._16_8_ = 0;
  buf.super_SmallStreamBuf<1024UL,_char>._24_8_ = 0;
  buf.super_SmallStreamBuf<1024UL,_char>._32_8_ = 0;
  buf.super_SmallStreamBuf<1024UL,_char>._40_8_ = 0;
  local_38 = __return_storage_ptr__;
  std::locale::locale((locale *)&buf.super_SmallStreamBuf<1024UL,_char>.field_0x30);
  __s = &buf.super_SmallStreamBuf<1024UL,_char>.field_0x38;
  memset(__s,0,0x418);
  local_750 = (undefined1  [8])&PTR__SmallStreamBuf_0019e2c8;
  buf.super_SmallStreamBuf<1024UL,_char>.buffer_ptr = (char *)0x0;
  buf.super_SmallStreamBuf<1024UL,_char>._32_8_ =
       buf.super_SmallStreamBuf<1024UL,_char>.short_buffer._M_elems + 10;
  buf.super_SmallStreamBuf<1024UL,_char>._24_8_ = __s;
  buf.super_SmallStreamBuf<1024UL,_char>._40_8_ =
       buf.super_SmallStreamBuf<1024UL,_char>.short_buffer._M_elems + 0x3f8;
  buf.super_SmallStreamBuf<1024UL,_char>.long_buffer.super__Vector_base<char,_std::allocator<char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __s;
  std::ostream::ostream(&local_170,(streambuf *)local_750);
  if ((message->
      super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
      ).
      super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
      .requiredBits.super__Base_bitset<1UL>._M_w != 3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf.off_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&buf.off_,"Missing ",8);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&buf.off_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," required value(s) for Message",0x1e)
    ;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,local_60);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((header->
      super_MessageT<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
      ).
      super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
      .requiredBits.super__Base_bitset<1UL>._M_w == 0xf) {
    lVar10 = buf.super_SmallStreamBuf<1024UL,_char>._24_8_ -
             buf.super_SmallStreamBuf<1024UL,_char>._32_8_;
    writeRaw<Fixpp::TagT<35u,Fixpp::Type::String>>((ostream *)&local_170,"A",1);
    write<meta::tuple<Fixpp::Field<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<115u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<128u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<90u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<91u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<50u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<142u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<57u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<143u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<116u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<144u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<129u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<145u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<43u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<97u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::Field<Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>>,Fixpp::Field<Fixpp::TagT<212u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<213u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<347u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<369u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul>
              (this,&local_170,header);
    write<meta::tuple<Fixpp::Field<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<95u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<96u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<141u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<383u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul>
              (this,&local_170,message);
    uVar2 = buf.super_SmallStreamBuf<1024UL,_char>._40_8_;
    uVar1 = buf.super_SmallStreamBuf<1024UL,_char>._24_8_;
    lVar9 = buf.super_SmallStreamBuf<1024UL,_char>._32_8_ -
            buf.super_SmallStreamBuf<1024UL,_char>._24_8_;
    iVar4 = StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'A'>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_1024UL>
            ::digitsCount((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_1024UL>
                           *)local_750,lVar10 + lVar9);
    buf.super_SmallStreamBuf<1024UL,_char>.buffer_ptr = (char *)(5 - (long)iVar4);
    (**(code **)((long)local_750 + 0x28))
              ((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_1024UL>
                *)local_750,buf.super_SmallStreamBuf<1024UL,_char>.buffer_ptr,0,0x18);
    writeTag<Fixpp::TagT<8u,Fixpp::Type::String>,char_const*const&>
              ((ostream *)&local_170,&v42::__VersionStaticHolder<Fixpp::v42::Version>::Str);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_170);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=",1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    buf.off_._0_1_ = 0x7c;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&buf.off_,1);
    psVar3 = local_38;
    pcVar6 = (char *)(long)(int)lVar9;
    buf.super_SmallStreamBuf<1024UL,_char>._32_8_ = pcVar6 + uVar1;
    for (pcVar8 = buf.super_SmallStreamBuf<1024UL,_char>.buffer_ptr; pcVar8 != pcVar6;
        pcVar8 = pcVar8 + 1) {
    }
    buf.super_SmallStreamBuf<1024UL,_char>._24_8_ = uVar1;
    buf.super_SmallStreamBuf<1024UL,_char>._40_8_ = uVar2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_170,"10=",3);
    lVar9 = *(long *)(local_170 + -0x18);
    if (acStack_90[lVar9 + 1] == '\0') {
      std::ios::widen((char)&local_170 + (char)lVar9);
      acStack_90[lVar9 + 1] = '\x01';
    }
    acStack_90[lVar9] = '0';
    *(undefined8 *)((long)auStack_160 + *(long *)(local_170 + -0x18)) = 3;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_170);
    buf.off_._0_1_ = 0x7c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_170,(char *)&buf.off_,1);
    (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar3,
               buf.super_SmallStreamBuf<1024UL,_char>.buffer_ptr +
               buf.super_SmallStreamBuf<1024UL,_char>._24_8_,
               buf.super_SmallStreamBuf<1024UL,_char>._32_8_);
    std::ios_base::~ios_base((ios_base *)&os);
    local_750 = (undefined1  [8])&PTR__SmallStreamBuf_0019e1a8;
    if (buf.super_SmallStreamBuf<1024UL,_char>.short_buffer._M_elems._1016_8_ != 0) {
      operator_delete((void *)buf.super_SmallStreamBuf<1024UL,_char>.short_buffer._M_elems._1016_8_,
                      (long)buf.super_SmallStreamBuf<1024UL,_char>.long_buffer.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      buf.super_SmallStreamBuf<1024UL,_char>.short_buffer._M_elems._1016_8_);
    }
    local_750 = (undefined1  [8])local_40;
    std::locale::~locale((locale *)&buf.super_SmallStreamBuf<1024UL,_char>.field_0x30);
    return psVar3;
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"Missing values for header");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string write(const Header& header, const Message& message)
    {
        StreamBuf<Message> buf;
        std::ostream os(&buf);

        if (!message.requiredBits.all())
        {
            std::ostringstream error;
            const size_t missingBits = message.requiredBits.size() - message.requiredBits.count();
            error << "Missing " << missingBits << " required value(s) for Message";
            throw std::runtime_error(error.str());
        }

        if (!header.requiredBits.all())
        {
            throw std::runtime_error("Missing values for header");
        }

        const auto startOffset = buf.offset();

        writeRaw<Tag::MsgType>(os, Message::MsgType::Value, Message::MsgType::Size);
        write(os, header.values, meta::seq::make_index_sequence<Header::TotalTags>());
        write(os, message.values, meta::seq::make_index_sequence<Message::TotalTags>());

        const auto endOffset = buf.offset();        

        const size_t size = endOffset - startOffset;

        auto context = buf.save();

        buf.prepareWriteHeader(size);

        writeTag<Tag::BeginString>(os, Message::Version::Str);
        os << Tag::BodyLength::Id << "=" << size << SOH;

        buf.restore(context);

        const size_t checksum = buf.checksum();
        os << "10=" << std::setfill('0') << std::setw(3) << checksum;

        os << SOH;

        return buf.asString();
    }